

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O1

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::computePrimalActivity
          (SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *primal,
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *activity,bool unscaled)

{
  int iVar1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *v;
  pointer pnVar2;
  undefined8 *puVar3;
  long lVar4;
  long lVar5;
  Item *pIVar6;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  *__range2;
  int iVar7;
  int *piVar8;
  int *piVar9;
  cpp_dec_float<200U,_int,_void> *pcVar10;
  cpp_dec_float<200U,_int,_void> *pcVar11;
  pointer pnVar12;
  cpp_dec_float<200U,_int,_void> *pcVar13;
  ulong uVar14;
  cpp_dec_float<200U,_int,_void> *pcVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  byte bVar19;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  tmp;
  type t;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_e0;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_c0;
  cpp_dec_float<200U,_int,_void> local_b8;
  
  bVar19 = 0;
  if ((this->
      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .set.thenum !=
      (int)((ulong)((long)(primal->val).
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(primal->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 7)) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(0x28);
    local_b8.data._M_elems._0_8_ = local_b8.data._M_elems + 4;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,
               "XSPXLP01 Primal vector for computing row activity has wrong dimension","");
    *puVar3 = &PTR__SPxException_006a9ee8;
    puVar3[1] = puVar3 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar3 + 1),local_b8.data._M_elems._0_8_,
               local_b8.data._M_elems._0_8_ + local_b8.data._M_elems._8_8_);
    *puVar3 = &PTR__SPxException_006a9ec0;
    __cxa_throw(puVar3,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
  }
  if ((this->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .set.thenum !=
      (int)((ulong)((long)(activity->val).
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(activity->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 7)) {
    puVar3 = (undefined8 *)__cxa_allocate_exception(0x28);
    local_b8.data._M_elems._0_8_ = local_b8.data._M_elems + 4;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,
               "XSPXLP03 Activity vector computing row activity has wrong dimension","");
    *puVar3 = &PTR__SPxException_006a9ee8;
    puVar3[1] = puVar3 + 3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(puVar3 + 1),local_b8.data._M_elems._0_8_,
               local_b8.data._M_elems._0_8_ + local_b8.data._M_elems._8_8_);
    *puVar3 = &PTR__SPxException_006a9ec0;
    __cxa_throw(puVar3,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
  }
  if ((this->
      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .set.thenum < 1) {
    uVar16 = 0;
  }
  else {
    lVar18 = 0;
    uVar16 = 0;
    do {
      pnVar2 = (primal->val).
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (*(int *)((long)(&(pnVar2->m_backend).data + 1) + lVar18 + 8U) == 2) break;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                (&local_b8,0,(type *)0x0);
      iVar1 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                        ((cpp_dec_float<200U,_int,_void> *)
                         ((long)(pnVar2->m_backend).data._M_elems + lVar18),&local_b8);
      if (iVar1 != 0) break;
      uVar16 = uVar16 + 1;
      lVar18 = lVar18 + 0x80;
    } while ((long)uVar16 <
             (long)(this->
                   super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).
                   super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   .set.thenum);
  }
  if ((int)uVar16 <
      (this->
      super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .set.thenum) {
    iVar1 = (this->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thenum;
    local_e0.
    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .m_elem = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)0x0;
    local_e0.
    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .memsize = 0;
    local_e0.
    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .memused = 0;
    local_e0._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_006b38e0;
    local_e0.theelem =
         (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)0x0;
    iVar7 = 2;
    if (0 < iVar1) {
      iVar7 = iVar1;
    }
    DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::allocMem(&local_e0,iVar7);
    uVar14 = uVar16 & 0xffffffff;
    if ((unscaled) && (this->_isScaled == true)) {
      (*this->lp_scaler->_vptr_SPxScaler[0x11])(this->lp_scaler,this,uVar16 & 0xffffffff,&local_e0);
      pnVar12 = (activity->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (pnVar2 = (activity->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pnVar2 != pnVar12;
          pnVar2 = pnVar2 + 1) {
        (pnVar2->m_backend).fpclass = cpp_dec_float_finite;
        (pnVar2->m_backend).prec_elem = 0x1c;
        (pnVar2->m_backend).data._M_elems[0] = 0;
        (pnVar2->m_backend).data._M_elems[1] = 0;
        (pnVar2->m_backend).data._M_elems[2] = 0;
        (pnVar2->m_backend).data._M_elems[3] = 0;
        (pnVar2->m_backend).data._M_elems[4] = 0;
        (pnVar2->m_backend).data._M_elems[5] = 0;
        (pnVar2->m_backend).data._M_elems[6] = 0;
        (pnVar2->m_backend).data._M_elems[7] = 0;
        (pnVar2->m_backend).data._M_elems[8] = 0;
        (pnVar2->m_backend).data._M_elems[9] = 0;
        (pnVar2->m_backend).data._M_elems[10] = 0;
        (pnVar2->m_backend).data._M_elems[0xb] = 0;
        (pnVar2->m_backend).data._M_elems[0xc] = 0;
        (pnVar2->m_backend).data._M_elems[0xd] = 0;
        (pnVar2->m_backend).data._M_elems[0xe] = 0;
        (pnVar2->m_backend).data._M_elems[0xf] = 0;
        (pnVar2->m_backend).data._M_elems[0x10] = 0;
        (pnVar2->m_backend).data._M_elems[0x11] = 0;
        (pnVar2->m_backend).data._M_elems[0x12] = 0;
        (pnVar2->m_backend).data._M_elems[0x13] = 0;
        (pnVar2->m_backend).data._M_elems[0x14] = 0;
        (pnVar2->m_backend).data._M_elems[0x15] = 0;
        (pnVar2->m_backend).data._M_elems[0x16] = 0;
        (pnVar2->m_backend).data._M_elems[0x17] = 0;
        (pnVar2->m_backend).data._M_elems[0x18] = 0;
        (pnVar2->m_backend).data._M_elems[0x19] = 0;
        (pnVar2->m_backend).data._M_elems[0x1a] = 0;
        (pnVar2->m_backend).data._M_elems[0x1b] = 0;
        *(undefined8 *)((long)(pnVar2->m_backend).data._M_elems + 0x6d) = 0;
      }
      if (0 < (long)local_e0.
                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .memused) {
        lVar18 = 0;
        do {
          piVar9 = (int *)((long)(&(local_e0.
                                    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   .m_elem)->val + 1) + lVar18);
          iVar1 = *piVar9;
          pnVar2 = (activity->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          piVar8 = piVar9 + -0x20;
          pnVar12 = pnVar2 + iVar1;
          for (lVar4 = 0x1c; lVar4 != 0; lVar4 = lVar4 + -1) {
            *(int *)&(pnVar12->m_backend).data = *piVar8;
            piVar8 = piVar8 + (ulong)bVar19 * -2 + 1;
            pnVar12 = (pointer)((long)pnVar12 + ((ulong)bVar19 * -2 + 1) * 4);
          }
          pnVar2[iVar1].m_backend.exp = piVar9[-4];
          pnVar2[iVar1].m_backend.neg = SUB41(piVar9[-3],0);
          iVar7 = piVar9[-1];
          pnVar2[iVar1].m_backend.fpclass = piVar9[-2];
          pnVar2[iVar1].m_backend.prec_elem = iVar7;
          lVar18 = lVar18 + 0x84;
        } while ((long)local_e0.
                       super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       .memused * 0x84 != lVar18);
      }
    }
    else {
      pIVar6 = (this->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.theitem +
               (this->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thekey[uVar14].idx;
      pnVar12 = (activity->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (pnVar2 = (activity->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; pnVar2 != pnVar12;
          pnVar2 = pnVar2 + 1) {
        (pnVar2->m_backend).fpclass = cpp_dec_float_finite;
        (pnVar2->m_backend).prec_elem = 0x1c;
        (pnVar2->m_backend).data._M_elems[0] = 0;
        (pnVar2->m_backend).data._M_elems[1] = 0;
        (pnVar2->m_backend).data._M_elems[2] = 0;
        (pnVar2->m_backend).data._M_elems[3] = 0;
        (pnVar2->m_backend).data._M_elems[4] = 0;
        (pnVar2->m_backend).data._M_elems[5] = 0;
        (pnVar2->m_backend).data._M_elems[6] = 0;
        (pnVar2->m_backend).data._M_elems[7] = 0;
        (pnVar2->m_backend).data._M_elems[8] = 0;
        (pnVar2->m_backend).data._M_elems[9] = 0;
        (pnVar2->m_backend).data._M_elems[10] = 0;
        (pnVar2->m_backend).data._M_elems[0xb] = 0;
        (pnVar2->m_backend).data._M_elems[0xc] = 0;
        (pnVar2->m_backend).data._M_elems[0xd] = 0;
        (pnVar2->m_backend).data._M_elems[0xe] = 0;
        (pnVar2->m_backend).data._M_elems[0xf] = 0;
        (pnVar2->m_backend).data._M_elems[0x10] = 0;
        (pnVar2->m_backend).data._M_elems[0x11] = 0;
        (pnVar2->m_backend).data._M_elems[0x12] = 0;
        (pnVar2->m_backend).data._M_elems[0x13] = 0;
        (pnVar2->m_backend).data._M_elems[0x14] = 0;
        (pnVar2->m_backend).data._M_elems[0x15] = 0;
        (pnVar2->m_backend).data._M_elems[0x16] = 0;
        (pnVar2->m_backend).data._M_elems[0x17] = 0;
        (pnVar2->m_backend).data._M_elems[0x18] = 0;
        (pnVar2->m_backend).data._M_elems[0x19] = 0;
        (pnVar2->m_backend).data._M_elems[0x1a] = 0;
        (pnVar2->m_backend).data._M_elems[0x1b] = 0;
        *(undefined8 *)((long)(pnVar2->m_backend).data._M_elems + 0x6d) = 0;
      }
      if (0 < (pIVar6->data).
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .memused) {
        lVar18 = 0x80;
        lVar4 = 0;
        do {
          piVar8 = (int *)((long)(((pIVar6->data).
                                   super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                  .m_elem)->val).m_backend.data._M_elems + lVar18);
          iVar1 = *piVar8;
          pnVar2 = (activity->val).
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          piVar9 = piVar8 + -0x20;
          pnVar12 = pnVar2 + iVar1;
          for (lVar17 = 0x1c; lVar17 != 0; lVar17 = lVar17 + -1) {
            *(int *)&(pnVar12->m_backend).data = *piVar9;
            piVar9 = piVar9 + (ulong)bVar19 * -2 + 1;
            pnVar12 = (pointer)((long)pnVar12 + ((ulong)bVar19 * -2 + 1) * 4);
          }
          pnVar2[iVar1].m_backend.exp = piVar8[-4];
          pnVar2[iVar1].m_backend.neg = SUB41(piVar8[-3],0);
          iVar7 = piVar8[-1];
          pnVar2[iVar1].m_backend.fpclass = piVar8[-2];
          pnVar2[iVar1].m_backend.prec_elem = iVar7;
          lVar4 = lVar4 + 1;
          lVar18 = lVar18 + 0x84;
        } while (lVar4 < (pIVar6->data).
                         super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         .memused);
      }
    }
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
    ::operator*=((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                  *)activity,
                 (primal->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar14);
    if ((int)uVar16 + 1 <
        (this->
        super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .set.thenum) {
      lVar18 = uVar14 + 1;
      local_c0 = this;
      do {
        pnVar2 = (primal->val).
                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (pnVar2[lVar18].m_backend.fpclass == cpp_dec_float_NaN) {
LAB_004d8208:
          if ((unscaled) && (local_c0->_isScaled == true)) {
            (*local_c0->lp_scaler->_vptr_SPxScaler[0x11])
                      (local_c0->lp_scaler,local_c0,lVar18,&local_e0);
            lVar4 = (long)local_e0.
                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .memused;
            if (0 < lVar4) {
              pcVar15 = &(primal->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar18].m_backend;
              lVar17 = lVar4 + 1;
              lVar4 = lVar4 * 0x84;
              do {
                pcVar10 = (cpp_dec_float<200U,_int,_void> *)
                          ((long)local_e0.
                                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 .m_elem[-1].val.m_backend.data._M_elems + lVar4);
                local_b8.fpclass = cpp_dec_float_finite;
                local_b8.prec_elem = 0x1c;
                local_b8.data._M_elems[0] = 0;
                local_b8.data._M_elems[1] = 0;
                local_b8.data._M_elems[2] = 0;
                local_b8.data._M_elems[3] = 0;
                local_b8.data._M_elems[4] = 0;
                local_b8.data._M_elems[5] = 0;
                local_b8.data._M_elems[6] = 0;
                local_b8.data._M_elems[7] = 0;
                local_b8.data._M_elems[8] = 0;
                local_b8.data._M_elems[9] = 0;
                local_b8.data._M_elems[10] = 0;
                local_b8.data._M_elems[0xb] = 0;
                local_b8.data._M_elems[0xc] = 0;
                local_b8.data._M_elems[0xd] = 0;
                local_b8.data._M_elems[0xe] = 0;
                local_b8.data._M_elems[0xf] = 0;
                local_b8.data._M_elems[0x10] = 0;
                local_b8.data._M_elems[0x11] = 0;
                local_b8.data._M_elems[0x12] = 0;
                local_b8.data._M_elems[0x13] = 0;
                local_b8.data._M_elems[0x14] = 0;
                local_b8.data._M_elems[0x15] = 0;
                local_b8.data._M_elems[0x16] = 0;
                local_b8.data._M_elems[0x17] = 0;
                local_b8.data._M_elems[0x18] = 0;
                local_b8.data._M_elems[0x19] = 0;
                local_b8.data._M_elems._104_5_ = 0;
                local_b8.data._M_elems[0x1b]._1_3_ = 0;
                local_b8.exp = 0;
                local_b8.neg = false;
                pcVar11 = pcVar15;
                if ((pcVar10 != &local_b8) && (pcVar11 = pcVar10, &local_b8 != pcVar15)) {
                  pcVar10 = pcVar15;
                  pcVar13 = &local_b8;
                  for (lVar5 = 0x1c; lVar5 != 0; lVar5 = lVar5 + -1) {
                    (pcVar13->data)._M_elems[0] = (pcVar10->data)._M_elems[0];
                    pcVar10 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar10 + (ulong)bVar19 * -8 + 4);
                    pcVar13 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar13 + (ulong)bVar19 * -8 + 4);
                  }
                  local_b8.exp = pcVar15->exp;
                  local_b8.neg = pcVar15->neg;
                  local_b8.fpclass = pcVar15->fpclass;
                  local_b8.prec_elem = pcVar15->prec_elem;
                }
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                          (&local_b8,pcVar11);
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                          (&(activity->val).
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start
                            [*(int *)((long)(&local_e0.
                                              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                              .m_elem[-1].val + 1) + lVar4)].m_backend,&local_b8);
                lVar17 = lVar17 + -1;
                lVar4 = lVar4 + -0x84;
              } while (1 < lVar17);
            }
          }
          else {
            pIVar6 = (local_c0->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.theitem;
            iVar1 = (local_c0->
                    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .set.thekey[lVar18].idx;
            lVar4 = (long)pIVar6[iVar1].data.
                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .memused;
            if (0 < lVar4) {
              pcVar15 = &(primal->val).
                         super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar18].m_backend;
              pIVar6 = pIVar6 + iVar1;
              lVar17 = lVar4 + 1;
              lVar4 = lVar4 * 0x84;
              do {
                pcVar10 = (cpp_dec_float<200U,_int,_void> *)
                          ((long)(pIVar6->data).
                                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 .m_elem[-1].val.m_backend.data._M_elems + lVar4);
                local_b8.fpclass = cpp_dec_float_finite;
                local_b8.prec_elem = 0x1c;
                local_b8.data._M_elems[0] = 0;
                local_b8.data._M_elems[1] = 0;
                local_b8.data._M_elems[2] = 0;
                local_b8.data._M_elems[3] = 0;
                local_b8.data._M_elems[4] = 0;
                local_b8.data._M_elems[5] = 0;
                local_b8.data._M_elems[6] = 0;
                local_b8.data._M_elems[7] = 0;
                local_b8.data._M_elems[8] = 0;
                local_b8.data._M_elems[9] = 0;
                local_b8.data._M_elems[10] = 0;
                local_b8.data._M_elems[0xb] = 0;
                local_b8.data._M_elems[0xc] = 0;
                local_b8.data._M_elems[0xd] = 0;
                local_b8.data._M_elems[0xe] = 0;
                local_b8.data._M_elems[0xf] = 0;
                local_b8.data._M_elems[0x10] = 0;
                local_b8.data._M_elems[0x11] = 0;
                local_b8.data._M_elems[0x12] = 0;
                local_b8.data._M_elems[0x13] = 0;
                local_b8.data._M_elems[0x14] = 0;
                local_b8.data._M_elems[0x15] = 0;
                local_b8.data._M_elems[0x16] = 0;
                local_b8.data._M_elems[0x17] = 0;
                local_b8.data._M_elems[0x18] = 0;
                local_b8.data._M_elems[0x19] = 0;
                local_b8.data._M_elems._104_5_ = 0;
                local_b8.data._M_elems[0x1b]._1_3_ = 0;
                local_b8.exp = 0;
                local_b8.neg = false;
                pcVar11 = pcVar15;
                if ((pcVar10 != &local_b8) && (pcVar11 = pcVar10, &local_b8 != pcVar15)) {
                  pcVar10 = pcVar15;
                  pcVar13 = &local_b8;
                  for (lVar5 = 0x1c; lVar5 != 0; lVar5 = lVar5 + -1) {
                    (pcVar13->data)._M_elems[0] = (pcVar10->data)._M_elems[0];
                    pcVar10 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar10 + (ulong)bVar19 * -8 + 4);
                    pcVar13 = (cpp_dec_float<200U,_int,_void> *)
                              ((long)pcVar13 + (ulong)bVar19 * -8 + 4);
                  }
                  local_b8.exp = pcVar15->exp;
                  local_b8.neg = pcVar15->neg;
                  local_b8.fpclass = pcVar15->fpclass;
                  local_b8.prec_elem = pcVar15->prec_elem;
                }
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator*=
                          (&local_b8,pcVar11);
                boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
                          (&(activity->val).
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start
                            [*(int *)((long)(&(pIVar6->data).
                                              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                              .m_elem[-1].val + 1) + lVar4)].m_backend,&local_b8);
                lVar17 = lVar17 + -1;
                lVar4 = lVar4 + -0x84;
              } while (1 < lVar17);
            }
          }
        }
        else {
          boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<long_long>
                    (&local_b8,0,(type *)0x0);
          iVar1 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                            (&pnVar2[lVar18].m_backend,&local_b8);
          if (iVar1 != 0) goto LAB_004d8208;
        }
        lVar18 = lVar18 + 1;
      } while ((int)lVar18 <
               (local_c0->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).
               super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .set.thenum);
    }
    local_e0._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_006b38e0;
    if (local_e0.theelem !=
        (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         *)0x0) {
      free(local_e0.theelem);
    }
  }
  else {
    pnVar12 = (activity->val).
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (pnVar2 = (activity->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pnVar2 != pnVar12; pnVar2 = pnVar2 + 1)
    {
      (pnVar2->m_backend).fpclass = cpp_dec_float_finite;
      (pnVar2->m_backend).prec_elem = 0x1c;
      (pnVar2->m_backend).data._M_elems[0] = 0;
      (pnVar2->m_backend).data._M_elems[1] = 0;
      (pnVar2->m_backend).data._M_elems[2] = 0;
      (pnVar2->m_backend).data._M_elems[3] = 0;
      (pnVar2->m_backend).data._M_elems[4] = 0;
      (pnVar2->m_backend).data._M_elems[5] = 0;
      (pnVar2->m_backend).data._M_elems[6] = 0;
      (pnVar2->m_backend).data._M_elems[7] = 0;
      (pnVar2->m_backend).data._M_elems[8] = 0;
      (pnVar2->m_backend).data._M_elems[9] = 0;
      (pnVar2->m_backend).data._M_elems[10] = 0;
      (pnVar2->m_backend).data._M_elems[0xb] = 0;
      (pnVar2->m_backend).data._M_elems[0xc] = 0;
      (pnVar2->m_backend).data._M_elems[0xd] = 0;
      (pnVar2->m_backend).data._M_elems[0xe] = 0;
      (pnVar2->m_backend).data._M_elems[0xf] = 0;
      (pnVar2->m_backend).data._M_elems[0x10] = 0;
      (pnVar2->m_backend).data._M_elems[0x11] = 0;
      (pnVar2->m_backend).data._M_elems[0x12] = 0;
      (pnVar2->m_backend).data._M_elems[0x13] = 0;
      (pnVar2->m_backend).data._M_elems[0x14] = 0;
      (pnVar2->m_backend).data._M_elems[0x15] = 0;
      (pnVar2->m_backend).data._M_elems[0x16] = 0;
      (pnVar2->m_backend).data._M_elems[0x17] = 0;
      (pnVar2->m_backend).data._M_elems[0x18] = 0;
      (pnVar2->m_backend).data._M_elems[0x19] = 0;
      (pnVar2->m_backend).data._M_elems[0x1a] = 0;
      (pnVar2->m_backend).data._M_elems[0x1b] = 0;
      *(undefined8 *)((long)(pnVar2->m_backend).data._M_elems + 0x6d) = 0;
    }
  }
  return;
}

Assistant:

inline
void SPxLPBase<R>::computePrimalActivity(const VectorBase<R>& primal, VectorBase<R>& activity,
      const bool unscaled) const
{
   if(primal.dim() != nCols())
      throw SPxInternalCodeException("XSPXLP01 Primal vector for computing row activity has wrong dimension");

   if(activity.dim() != nRows())
      throw SPxInternalCodeException("XSPXLP03 Activity vector computing row activity has wrong dimension");

   int c;

   for(c = 0; c < nCols() && primal[c] == 0; c++)
      ;

   if(c >= nCols())
   {
      activity.clear();
      return;
   }

   DSVectorBase<R> tmp(nRows());

   if(unscaled && _isScaled)
   {
      lp_scaler->getColUnscaled(*this, c, tmp);
      activity = tmp;
   }
   else
      activity = colVector(c);

   activity *= primal[c];
   c++;

   for(; c < nCols(); c++)
   {
      if(primal[c] != 0)
      {
         if(unscaled && _isScaled)
         {
            lp_scaler->getColUnscaled(*this, c, tmp);
            activity.multAdd(primal[c], tmp);
         }
         else
            activity.multAdd(primal[c], colVector(c));
      }
   }
}